

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShadingLanguage420PackTests.cpp
# Opt level: O2

void __thiscall
gl4cts::GLSL420Pack::BindingUniformBlockArrayTest::releaseResource
          (BindingUniformBlockArrayTest *this)

{
  GLuint i;
  long lVar1;
  buffer *buffers [14];
  buffer *local_78 [14];
  
  local_78[0] = &this->m_goku_00_buffer;
  local_78[1] = &this->m_goku_01_buffer;
  local_78[2] = &this->m_goku_02_buffer;
  local_78[3] = &this->m_goku_03_buffer;
  local_78[4] = &this->m_goku_04_buffer;
  local_78[5] = &this->m_goku_05_buffer;
  local_78[6] = &this->m_goku_06_buffer;
  local_78[7] = &this->m_goku_07_buffer;
  local_78[8] = &this->m_goku_08_buffer;
  local_78[9] = &this->m_goku_09_buffer;
  local_78[10] = &this->m_goku_10_buffer;
  local_78[0xb] = &this->m_goku_11_buffer;
  local_78[0xc] = &this->m_goku_12_buffer;
  local_78[0xd] = &this->m_goku_13_buffer;
  for (lVar1 = 0; lVar1 != 0xe; lVar1 = lVar1 + 1) {
    Utils::buffer::release(local_78[lVar1]);
  }
  return;
}

Assistant:

void BindingUniformBlockArrayTest::releaseResource()
{
	Utils::buffer* buffers[14] = { &m_goku_00_buffer, &m_goku_01_buffer, &m_goku_02_buffer, &m_goku_03_buffer,
								   &m_goku_04_buffer, &m_goku_05_buffer, &m_goku_06_buffer, &m_goku_07_buffer,
								   &m_goku_08_buffer, &m_goku_09_buffer, &m_goku_10_buffer, &m_goku_11_buffer,
								   &m_goku_12_buffer, &m_goku_13_buffer };

	for (GLuint i = 0; i < 14; ++i)
	{
		buffers[i]->release();
	}
}